

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct::create_pipeline(InnerProduct *this,Option *opt)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  void *ptr;
  Option opt_q;
  void *local_120;
  int *local_118;
  size_t local_110;
  int local_108;
  Allocator *local_100;
  undefined4 local_f8;
  int iStack_f4;
  undefined8 uStack_f0;
  size_t local_e8;
  long local_e0;
  Mat local_d8;
  Mat local_98;
  Option local_58;
  
  if (((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 4)) &&
     (this->int8_scale_term != 0)) {
    iStack_f4 = this->weight_data_size;
    local_e8 = (size_t)iStack_f4;
    local_110 = 1;
    local_108 = 1;
    local_100 = (Allocator *)0x0;
    local_f8 = 1;
    uStack_f0 = 0x100000001;
    if (local_e8 != 0) {
      uVar5 = local_e8 + 3 & 0xfffffffffffffffc;
      local_d8.data = (void *)0x0;
      iVar3 = posix_memalign(&local_d8.data,0x10,uVar5 + 4);
      local_120 = (void *)0x0;
      if (iVar3 == 0) {
        local_120 = local_d8.data;
      }
      local_118 = (int *)((long)local_120 + uVar5);
      *(undefined4 *)((long)local_120 + uVar5) = 1;
      lVar6 = (long)uStack_f0._4_4_ * local_e8;
      if (lVar6 != 0) {
        iVar3 = this->weight_data_size / this->num_output;
        local_e0 = lVar6;
        if (0 < this->num_output) {
          sVar4 = (size_t)iVar3;
          lVar6 = 0;
          lVar7 = 0;
          do {
            local_58.lightmode = opt->lightmode;
            local_58._1_3_ = *(undefined3 *)&opt->field_0x1;
            local_58.num_threads = opt->num_threads;
            local_58.workspace_allocator = opt->workspace_allocator;
            local_58.use_winograd_convolution = opt->use_winograd_convolution;
            local_58.use_sgemm_convolution = opt->use_sgemm_convolution;
            local_58.use_int8_inference = opt->use_int8_inference;
            local_58.use_vulkan_compute = opt->use_vulkan_compute;
            local_58.use_fp16_packed = opt->use_fp16_packed;
            local_58.use_fp16_storage = opt->use_fp16_storage;
            local_58.use_fp16_arithmetic = opt->use_fp16_arithmetic;
            local_58.use_int8_storage = opt->use_int8_storage;
            local_58.use_int8_arithmetic = opt->use_int8_arithmetic;
            local_58.use_packing_layout = opt->use_packing_layout;
            local_58.use_shader_pack8 = opt->use_shader_pack8;
            local_58.use_bf16_storage = opt->use_bf16_storage;
            local_58._36_4_ = *(undefined4 *)&opt->field_0x24;
            local_58.blob_allocator = local_100;
            local_d8.elemsize = (this->weight_data).elemsize;
            local_d8.data = (void *)(local_d8.elemsize * lVar6 + (long)(this->weight_data).data);
            local_d8.elempack = (this->weight_data).elempack;
            local_d8.allocator = (this->weight_data).allocator;
            local_d8.refcount = (int *)0x0;
            local_d8.dims = 1;
            local_d8.h = 1;
            local_d8.c = 1;
            local_98.data = (void *)(local_110 * lVar6 + (long)local_120);
            local_98.refcount = (int *)0x0;
            local_98.elemsize = local_110;
            local_98.elempack = local_108;
            local_98.allocator = local_100;
            local_98.dims = 1;
            local_98.h = 1;
            local_98.c = 1;
            local_d8.w = iVar3;
            local_d8.cstep = sVar4;
            local_98.w = iVar3;
            local_98.cstep = sVar4;
            quantize_float32_to_int8
                      (&local_d8,&local_98,
                       *(float *)((long)(this->weight_data_int8_scales).data + lVar7 * 4),&local_58)
            ;
            if (local_98.refcount != (int *)0x0) {
              LOCK();
              *local_98.refcount = *local_98.refcount + -1;
              UNLOCK();
              if (*local_98.refcount == 0) {
                if (local_98.allocator == (Allocator *)0x0) {
                  if (local_98.data != (void *)0x0) {
                    free(local_98.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_98.allocator + 0x18))();
                }
              }
            }
            if (local_d8.refcount != (int *)0x0) {
              LOCK();
              *local_d8.refcount = *local_d8.refcount + -1;
              UNLOCK();
              if (*local_d8.refcount == 0) {
                if (local_d8.allocator == (Allocator *)0x0) {
                  if (local_d8.data != (void *)0x0) {
                    free(local_d8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_d8.allocator + 0x18))();
                }
              }
            }
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + sVar4;
          } while (lVar7 < this->num_output);
        }
        lVar6 = local_e0;
        if (&this->weight_data != (Mat *)&local_120) {
          if (local_118 != (int *)0x0) {
            LOCK();
            *local_118 = *local_118 + 1;
            UNLOCK();
          }
          piVar1 = (this->weight_data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              __ptr = (this->weight_data).data;
              pAVar2 = (this->weight_data).allocator;
              if (pAVar2 == (Allocator *)0x0) {
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)(*(long *)pAVar2 + 0x18))();
              }
            }
          }
          (this->weight_data).data = local_120;
          (this->weight_data).refcount = local_118;
          (this->weight_data).elemsize = local_110;
          (this->weight_data).elempack = local_108;
          (this->weight_data).allocator = local_100;
          (this->weight_data).dims = local_f8;
          (this->weight_data).w = iStack_f4;
          (this->weight_data).h = (undefined4)uStack_f0;
          (this->weight_data).c = uStack_f0._4_4_;
          (this->weight_data).cstep = local_e8;
        }
        if (local_118 == (int *)0x0) goto LAB_001325c5;
      }
      LOCK();
      *local_118 = *local_118 + -1;
      UNLOCK();
      if (*local_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          if (local_120 != (void *)0x0) {
            free(local_120);
          }
        }
        else {
          (**(code **)(*(long *)local_100 + 0x18))();
        }
      }
      if (lVar6 != 0) goto LAB_001325c5;
    }
    iVar3 = -100;
  }
  else {
LAB_001325c5:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int InnerProduct::create_pipeline(const Option& opt)
{
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int p=0; p<num_output; p++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * p, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * p, weight_data_size_output);
            quantize_float32_to_int8(weight_data_n, int8_weight_data_n, weight_data_int8_scales[p], opt_q);
        }

        weight_data = int8_weight_data;
    }

    return 0;
}